

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O3

int get_array_options_inner
              (char *json_string,char *option_name,size_t *count,char ***string_array,
              int **int_array,int is_string_array)

{
  json_t *json;
  json_t *json_00;
  size_t sVar1;
  char **ppcVar2;
  json_t *json_01;
  char *pcVar3;
  longlong lVar4;
  int *piVar5;
  
  json = get_root_option_json_object(json_string);
  piVar5 = (int *)&DAT_ffffffff;
  if (json == (json_t *)0x0) goto LAB_00105964;
  json_00 = json_object_get(json,option_name);
  if (json_00 == (json_t *)0x0) {
    sVar1 = json->refcount;
    piVar5 = (int *)0x0;
LAB_00105876:
    if (sVar1 == 0xffffffffffffffff) goto LAB_00105964;
    sVar1 = sVar1 - 1;
    json->refcount = sVar1;
  }
  else {
    if (json_00->type != JSON_ARRAY) {
      fprintf(_stderr,"error: option item %s is expected to be a array\n",option_name);
      sVar1 = json->refcount;
      goto LAB_00105876;
    }
    sVar1 = json_array_size(json_00);
    *count = sVar1;
    if (is_string_array == 0) {
      piVar5 = (int *)malloc(sVar1 * 4);
      ppcVar2 = (char **)option_name;
    }
    else {
      ppcVar2 = (char **)malloc(sVar1 * 8);
    }
    if ((is_string_array != 0 && ppcVar2 == (char **)0x0) ||
       (is_string_array == 0 && piVar5 == (int *)0x0)) {
      fprintf(_stderr,"error: couldn\'t allocate array for option %s (%zu items)\n",option_name,
              sVar1);
      if (json->refcount == 0xffffffffffffffff) {
LAB_001059fd:
        piVar5 = (int *)&DAT_ffffffff;
        goto LAB_00105964;
      }
      sVar1 = json->refcount - 1;
      json->refcount = sVar1;
      piVar5 = (int *)&DAT_ffffffff;
    }
    else {
      if (sVar1 != 0) {
        sVar1 = 0;
        do {
          json_01 = json_array_get(json_00,sVar1);
          if (is_string_array == 0) {
            if ((json_01 == (json_t *)0x0) || (json_01->type != JSON_INTEGER)) goto LAB_001059e8;
            lVar4 = json_integer_value(json_01);
            piVar5[sVar1] = (int)lVar4;
          }
          else {
            if ((json_01 == (json_t *)0x0) || (json_01->type != JSON_STRING)) {
LAB_001059e8:
              get_array_options_inner_cold_1();
              goto LAB_001059fd;
            }
            pcVar3 = json_string_value(json_01);
            pcVar3 = strdup(pcVar3);
            ppcVar2[sVar1] = pcVar3;
          }
          sVar1 = sVar1 + 1;
        } while (sVar1 < *count);
      }
      if (is_string_array == 0) {
        *int_array = piVar5;
      }
      else {
        *string_array = ppcVar2;
      }
      piVar5 = (int *)0x1;
      if (json->refcount == 0xffffffffffffffff) goto LAB_00105964;
      sVar1 = json->refcount - 1;
      json->refcount = sVar1;
    }
  }
  if (sVar1 == 0) {
    json_delete(json);
  }
LAB_00105964:
  return (int)piVar5;
}

Assistant:

static int get_array_options_inner(const char * json_string, const char * option_name, size_t * count, char *** string_array, int ** int_array, int is_string_array)
{
	json_t * root, *option_array, *option_item;
	char ** option_strings;
	int * option_ints;
	size_t i;

	root = get_root_option_json_object(json_string);
	if (!root)
		return -1;

	option_array = json_object_get(root, option_name);
	if (!option_array)
	{
		json_decref(root);
		return 0;
	}

	if (!json_is_array(option_array))
	{
		fprintf(stderr, "error: option item %s is expected to be a array\n", option_name);
		json_decref(root);
		return -1;
	}

	*count = json_array_size(option_array);
	if(is_string_array)
		option_strings = malloc(*count * sizeof(char *));
	else
		option_ints = malloc(*count * sizeof(int));
	if ((is_string_array && !option_strings) || (!is_string_array && !option_ints))
	{
		fprintf(stderr, "error: couldn't allocate array for option %s (%zu items)\n", option_name, *count);
		json_decref(root);
		return -1;
	}
	for (i = 0; i < *count; i++)
	{
		option_item = json_array_get(option_array, i);
		if ((is_string_array && !json_is_string(option_item)) || (!is_string_array && !json_is_integer(option_item)))
		{
			fprintf(stderr, "error: option %zu in array %s is expected to be a %s\n", i, option_name, is_string_array ? "string" : "integer");
			json_decref(root);
			free(option_strings);
			return -1;
		}
		if(is_string_array)
			option_strings[i] = strdup(json_string_value(option_item));
		else
			option_ints[i] = json_integer_value(option_item);
	}

	if (is_string_array)
		*string_array = option_strings;
	else
		*int_array = option_ints;

	json_decref(root);
	return 1;
}